

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  Boolean BVar3;
  uchar **r;
  uchar **g;
  uchar **b;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  GSFloodFill<unsigned_char> *pGVar7;
  ostream *poVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  int local_280;
  allocator<char> local_279;
  ulong local_278;
  ulong local_270;
  undefined4 local_268 [2];
  Mat *local_260;
  undefined8 local_258;
  string iFileName;
  _Vector_base<int,_std::allocator<int>_> local_1e8;
  _InputArray local_1c8;
  string oFileName;
  string dFileName;
  string XSDPath;
  Mat src;
  int local_148;
  int local_144;
  Mat dst;
  Mat diff;
  
  iFileName._M_dataplus._M_p = (pointer)&iFileName.field_2;
  iFileName._M_string_length = 0;
  oFileName._M_dataplus._M_p = (pointer)&oFileName.field_2;
  oFileName._M_string_length = 0;
  iFileName.field_2._M_local_buf[0] = '\0';
  oFileName.field_2._M_local_buf[0] = '\0';
  dFileName._M_dataplus._M_p = (pointer)&dFileName.field_2;
  dFileName._M_string_length = 0;
  dFileName.field_2._M_local_buf[0] = '\0';
  cv::Mat::Mat(&src);
  cv::Mat::Mat(&dst);
  cv::Mat::Mat(&diff);
  XSDPath._M_dataplus._M_p = (pointer)&XSDPath.field_2;
  XSDPath._M_string_length = 0;
  local_280 = 0;
  XSDPath.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    local_280 = 0;
    for (iVar12 = 1; iVar12 < argc; iVar12 = iVar12 + 1) {
      iVar2 = local_280;
      if (*argv[iVar12] == '-') {
        cVar1 = argv[iVar12][1];
        if (cVar1 == 'd') {
          std::__cxx11::string::assign((char *)&dFileName);
        }
        else if (cVar1 == 'i') {
          std::__cxx11::string::assign((char *)&iFileName);
        }
        else if (cVar1 == 'o') {
          std::__cxx11::string::assign((char *)&oFileName);
        }
        else {
          iVar2 = 1;
          if (cVar1 == 'v') goto LAB_00105a92;
          if (cVar1 != 'x') {
            if (cVar1 != 'h') {
              poVar8 = std::operator<<((ostream *)&std::cerr,"Unknown switch.\n");
              std::endl<char,std::char_traits<char>>(poVar8);
              printHelp();
              goto LAB_00105f50;
            }
            iVar12 = 0;
            printHelp();
            goto LAB_00105f53;
          }
          std::__cxx11::string::assign((char *)&XSDPath);
        }
        iVar12 = iVar12 + 1;
        iVar2 = local_280;
      }
LAB_00105a92:
      local_280 = iVar2;
    }
  }
  if (iFileName._M_string_length == 0) {
    std::operator<<((ostream *)&std::cerr,"Option -i <filename> must be present! Aborting...\n");
  }
  else {
    if (oFileName._M_string_length == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Option -o <filename> is missing. Output file name is set to \'output.jpg\'\n"
                     );
      std::__cxx11::string::assign((char *)&oFileName);
    }
    cv::imread((string *)local_268,(int)&iFileName);
    cv::Mat::operator=(&src,(Mat *)local_268);
    cv::Mat::~Mat((Mat *)local_268);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"Input image",(allocator<char> *)&local_1c8);
    cv::namedWindow((string *)local_268,1);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"Input image",(allocator<char> *)&local_1e8);
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = 0x1010000;
    local_1c8.obj = &src;
    cv::imshow((string *)local_268,&local_1c8);
    std::__cxx11::string::~string((string *)local_268);
    poVar8 = std::operator<<((ostream *)&std::cout,"Image ");
    poVar8 = std::operator<<(poVar8,(string *)&iFileName);
    poVar8 = std::operator<<(poVar8," consists of ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(_src >> 3 & 0x1ff) + 1);
    poVar8 = std::operator<<(poVar8," channels and ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_144);
    poVar8 = std::operator<<(poVar8,"x");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_148);
    std::operator<<(poVar8," pixels.\n");
    local_258 = 0;
    local_268[0] = 0x2010000;
    local_260 = &dst;
    cv::Mat::copyTo((_OutputArray *)&src);
    lVar13 = (long)local_144;
    local_278 = (ulong)local_148;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (long)local_278) {
      uVar9 = local_278 * 8;
    }
    r = (uchar **)operator_new__(uVar9);
    g = (uchar **)operator_new__(uVar9);
    b = (uchar **)operator_new__(uVar9);
    local_270 = (ulong)(local_144 * (int)local_278);
    puVar4 = (uchar *)operator_new__(local_270);
    puVar5 = (uchar *)operator_new__(local_270);
    puVar6 = (uchar *)operator_new__(local_270);
    uVar10 = 0;
    uVar9 = 0;
    if (0 < (int)local_278) {
      uVar9 = local_278 & 0xffffffff;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      r[uVar10] = puVar4;
      puVar4 = puVar4 + lVar13;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      g[uVar10] = puVar5;
      puVar5 = puVar5 + lVar13;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      b[uVar10] = puVar6;
      puVar6 = puVar6 + lVar13;
    }
    fromMat2RGB(&src,r,g,b);
    pGVar7 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
    GSFloodFill<unsigned_char>::GSFloodFill(pGVar7,r,(int)local_278,local_144);
    pGVar7->verbose = local_280;
    BVar3 = GSFloodFill<unsigned_char>::Transform(pGVar7);
    if (BVar3) {
      GSFloodFill<unsigned_char>::~GSFloodFill(pGVar7);
      operator_delete(pGVar7,0xa0);
      pGVar7 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
      GSFloodFill<unsigned_char>::GSFloodFill(pGVar7,g,(int)local_278,local_144);
      pGVar7->verbose = local_280;
      BVar3 = GSFloodFill<unsigned_char>::Transform(pGVar7);
      if (BVar3) {
        GSFloodFill<unsigned_char>::~GSFloodFill(pGVar7);
        operator_delete(pGVar7,0xa0);
        pGVar7 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
        GSFloodFill<unsigned_char>::GSFloodFill(pGVar7,b,(int)local_278,local_144);
        pGVar7->verbose = local_280;
        BVar3 = GSFloodFill<unsigned_char>::Transform(pGVar7);
        if (BVar3) {
          GSFloodFill<unsigned_char>::~GSFloodFill(pGVar7);
          operator_delete(pGVar7,0xa0);
          fromRGB2Mat(&dst,r,g,b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_268,"Flood-filled image",(allocator<char> *)&local_1c8);
          cv::namedWindow((string *)local_268,1);
          std::__cxx11::string::~string((string *)local_268);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_268,"Flood-filled image",(allocator<char> *)&local_1e8);
          local_1c8.sz.width = 0;
          local_1c8.sz.height = 0;
          local_1c8.flags = 0x1010000;
          local_1c8.obj = &dst;
          cv::imshow((string *)local_268,&local_1c8);
          std::__cxx11::string::~string((string *)local_268);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_268,"FloodFilled.jpg",&local_279);
          local_1c8.sz.width = 0;
          local_1c8.sz.height = 0;
          local_1c8.flags = 0x1010000;
          local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c8.obj = &dst;
          cv::imwrite((string *)local_268,&local_1c8,(vector *)&local_1e8);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1e8);
          std::__cxx11::string::~string((string *)local_268);
          if (dFileName._M_string_length != 0) {
            local_258 = 0;
            local_268[0] = 0x2010000;
            local_260 = &diff;
            cv::Mat::copyTo((_OutputArray *)&dst);
            BVar3 = diffMat(&diff,&src);
            std::__cxx11::string::~string((string *)&XSDPath);
            cv::Mat::~Mat(&diff);
            cv::Mat::~Mat(&dst);
            cv::Mat::~Mat(&src);
            std::__cxx11::string::~string((string *)&dFileName);
            std::__cxx11::string::~string((string *)&oFileName);
            std::__cxx11::string::~string((string *)&iFileName);
            _Unwind_Resume(BVar3);
          }
          iVar12 = 0;
          cv::waitKey(0);
          goto LAB_00105f53;
        }
        pcVar11 = "floodFill.Transform (b) has failed! Aborting...\n";
      }
      else {
        pcVar11 = "floodFill.Transform (g) has failed! Aborting...\n";
      }
    }
    else {
      pcVar11 = "floodFill.Transform (r) has failed! Aborting...\n";
    }
    std::operator<<((ostream *)&std::cerr,pcVar11);
  }
LAB_00105f50:
  iVar12 = -1;
LAB_00105f53:
  std::__cxx11::string::~string((string *)&XSDPath);
  cv::Mat::~Mat(&diff);
  cv::Mat::~Mat(&dst);
  cv::Mat::~Mat(&src);
  std::__cxx11::string::~string((string *)&dFileName);
  std::__cxx11::string::~string((string *)&oFileName);
  std::__cxx11::string::~string((string *)&iFileName);
  return iVar12;
}

Assistant:

int main(int argc, char *argv[])
{
	int i, j;
	string iFileName;
	string oFileName;
	string dFileName;
	Mat src, dst, diff;
	string XSDPath;
	int rows, cols;
	Boolean error;
	int verbose;

	verbose=0;
	// manage command-line args
	if (argc>1)
	for (i=1; i<argc; i++)
		if (argv[i][0] == '-')
		switch(argv[i][1]) {
		case 'v': verbose=1; break;
		case 'h': printHelp(); return 0;
		case 'i': iFileName = argv[++i]; break;
		case 'o': oFileName = argv[++i]; break;
		case 'd': dFileName = argv[++i]; break;
		case 'x': XSDPath = argv[++i]; break;

		default: std::cerr << "Unknown switch.\n" << std::endl;
				 printHelp();
				 return -1;
		}



	if (iFileName.empty()) {
		std::cerr << "Option -i <filename> must be present! Aborting...\n";
		return -1;
	}
	if (oFileName.empty()) {
		std::cerr << "Option -o <filename> is missing. Output file name is set to 'output.jpg'\n";
		oFileName = "output.jpg";
	}

	src = imread(iFileName, cv::IMREAD_COLOR);
	namedWindow("Input image", CV_WINDOW_AUTOSIZE );
	imshow("Input image", src );

	std::cout << "Image " << iFileName << " consists of " << src.channels() << " channels and "
		<< src.cols << "x" << src.rows << " pixels.\n";

	//dst = imread(iFileName, CV_LOAD_IMAGE_COLOR); //src.clone();
	src.copyTo(dst);

	cols = src.cols;
	rows = src.rows;

	unsigned char **r, **g, **b;
	unsigned char *buffr, *buffg, *buffb;

	r = new unsigned char *[rows];
	g = new unsigned char *[rows];
	b = new unsigned char *[rows];

	buffr = new unsigned char[ cols * rows ];
	buffg = new unsigned char[ cols * rows ];
	buffb = new unsigned char[ cols * rows ];

	for (int i=0, disp=0; i<rows; i++, disp += cols)
		r[i] = & buffr[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		g[i] = & buffg[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		b[i] = & buffb[disp];

	fromMat2RGB(src, r, g, b);

	/*
	unsigned char *origr, *origg, *origb;
	if (! dFileName.empty()) {
		origr = new unsigned char[ cols * rows ];
		origg = new unsigned char[ cols * rows ];
		origb = new unsigned char[ cols * rows ];
		int rxc = rows*cols;
		for (i=0; i<rxc; i++) {
			origr[i] = buffr[i];
			origg[i] = buffg[i];
			origb[i] = buffb[i];
		}
	}
	*/

	GSFloodFill<unsigned char> *floodFill;


	floodFill = new GSFloodFill<unsigned char>(r, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (r) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(g, rows, cols);
	//GSFloodFill<unsigned char> floodFill(g, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (g) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(b, rows, cols);
	//GSFloodFill<unsigned char> floodFill(b, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (b) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;


	// Now r, g and b point to the flood-filled transformation of the three input bands

	// (r,g,b) => dst
	fromRGB2Mat(dst, r, g, b);

	namedWindow( "Flood-filled image", CV_WINDOW_AUTOSIZE );
	imshow("Flood-filled image", dst );

	imwrite("FloodFilled.jpg", dst );



	if (! dFileName.empty()) {
		dst.copyTo(diff);
		diffMat(diff, src);

		namedWindow( "Difference image", CV_WINDOW_AUTOSIZE );
		imshow("Difference image", diff );
		imwrite("Difference.jpg", diff );
	}

	waitKey(0);
	return 0;
}